

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleStringCacheAllocator_allocationIsCached_Test::
TEST_SimpleStringCacheAllocator_allocationIsCached_Test
          (TEST_SimpleStringCacheAllocator_allocationIsCached_Test *this)

{
  TEST_SimpleStringCacheAllocator_allocationIsCached_Test *this_local;
  
  memset(this,0,0x50);
  TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator::
  TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator
            (&this->super_TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_SimpleStringCacheAllocator_allocationIsCached_Test_003f7500;
  return;
}

Assistant:

TEST(SimpleStringCacheAllocator, allocationIsCached)
{
    char* mem = allocator->alloc_memory(10, __FILE__, __LINE__);
    allocator->free_memory(mem, 10,  __FILE__, __LINE__);

    size_t totalAllocations = accountant.totalAllocations();
    size_t totalDeallocations = accountant.totalDeallocations();

    mem = allocator->alloc_memory(10, __FILE__, __LINE__);
    allocator->free_memory(mem, 10,  __FILE__, __LINE__);

    LONGS_EQUAL(totalAllocations, accountant.totalAllocations());
    LONGS_EQUAL(totalDeallocations, accountant.totalDeallocations());
}